

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ogt_vox.h
# Opt level: O0

ogt_vox_keyframe_transform * __thiscall
_vox_suballoc_array::get_ptr<ogt_vox_keyframe_transform>(_vox_suballoc_array *this,size_t offset)

{
  ogt_vox_keyframe_transform *poVar1;
  size_t offset_local;
  _vox_suballoc_array *this_local;
  
  if (offset % 0x44 != 0) {
    __assert_fail("(0 == offset % sizeof(T)) && (\"offset is not properly aligned for this datatype\")"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_vox.h"
                  ,0x354,"T *_vox_suballoc_array::get_ptr(size_t) [T = ogt_vox_keyframe_transform]")
    ;
  }
  poVar1 = (ogt_vox_keyframe_transform *)_vox_array<char>::operator[](&this->data,offset);
  return poVar1;
}

Assistant:

T * get_ptr(size_t offset) {
            ogt_assert(0 == offset % sizeof(T), "offset is not properly aligned for this datatype");
            return (T*)&data[offset];
        }